

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveRedundantMaterials.cpp
# Opt level: O0

void __thiscall
Assimp::RemoveRedundantMatsProcess::~RemoveRedundantMatsProcess(RemoveRedundantMatsProcess *this)

{
  RemoveRedundantMatsProcess *this_local;
  
  ~RemoveRedundantMatsProcess(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

RemoveRedundantMatsProcess::~RemoveRedundantMatsProcess()
{
    // nothing to do here
}